

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseFalse<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  char *pcVar1;
  Ch *pCVar2;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar3;
  char *pcVar4;
  
  pcVar1 = is->src_;
  if (*pcVar1 != 'f') {
    __assert_fail("is.Peek() == \'f\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                  ,0x372,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  pcVar4 = pcVar1 + 1;
  is->src_ = pcVar4;
  if (pcVar1[1] == 'a') {
    pcVar4 = pcVar1 + 2;
    is->src_ = pcVar4;
    if (pcVar1[2] == 'l') {
      pcVar4 = pcVar1 + 3;
      is->src_ = pcVar4;
      if (pcVar1[3] == 's') {
        pcVar4 = pcVar1 + 4;
        is->src_ = pcVar4;
        if (pcVar1[4] == 'e') {
          is->src_ = pcVar1 + 5;
          pGVar3 = internal::Stack<rapidjson::CrtAllocator>::
                   Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                             (&handler->stack_,1);
          (pGVar3->data_).n = (Number)0x0;
          (pGVar3->data_).s.str = (Ch *)0x0;
          (pGVar3->data_).f.flags = 9;
          return;
        }
      }
    }
  }
  if (*(int *)(this + 0x30) == 0) {
    pCVar2 = is->head_;
    *(undefined4 *)(this + 0x30) = 3;
    *(long *)(this + 0x38) = (long)pcVar4 - (long)pCVar2;
    return;
  }
  __assert_fail("!HasParseError()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                ,0x37a,
                "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
               );
}

Assistant:

void ParseFalse(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == 'f');
        is.Take();

        if (RAPIDJSON_LIKELY(Consume(is, 'a') && Consume(is, 'l') && Consume(is, 's') && Consume(is, 'e'))) {
            if (RAPIDJSON_UNLIKELY(!handler.Bool(false)))
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, is.Tell());
    }